

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::DatabaseInterface::load_whitelist_database(DatabaseInterface *this,char *path)

{
  Impl *pIVar1;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var2;
  bool bVar3;
  char cVar4;
  LogLevel LVar5;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var6;
  
  pIVar1 = this->impl;
  if (pIVar1->mode == ReadOnly) {
    if ((pIVar1->imported_metadata).
        super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pIVar1->imported_metadata).
        super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var6._M_head_impl = create_stream_archive_database(path,ReadOnly);
      _Var2._M_head_impl =
           (pIVar1->whitelist)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      (pIVar1->whitelist)._M_t.
      super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
      ._M_t.
      super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
      .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
           _Var6._M_head_impl;
      if (_Var2._M_head_impl != (DatabaseInterface *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_DatabaseInterface + 8))();
      }
      _Var2._M_head_impl =
           (this->impl->whitelist)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (_Var2._M_head_impl != (DatabaseInterface *)0x0) {
        cVar4 = (**(code **)((long)(_Var2._M_head_impl)->_vptr_DatabaseInterface + 0x10))();
        if (cVar4 != '\0') {
          return true;
        }
        _Var2._M_head_impl =
             (this->impl->whitelist)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
        (this->impl->whitelist)._M_t.
        super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
        ._M_t.
        super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
        .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
             (DatabaseInterface *)0x0;
        if (_Var2._M_head_impl != (DatabaseInterface *)0x0) {
          (**(code **)((long)(_Var2._M_head_impl)->_vptr_DatabaseInterface + 8))();
        }
      }
    }
    else {
      LVar5 = get_thread_log_level();
      if ((int)LVar5 < 3) {
        bVar3 = Internal::log_thread_callback
                          (LOG_ERROR,"Cannot use imported metadata together with whitelists.\n");
        if (bVar3) {
          return false;
        }
        load_whitelist_database();
      }
    }
  }
  return false;
}

Assistant:

bool DatabaseInterface::load_whitelist_database(const char *path)
{
	if (impl->mode != DatabaseMode::ReadOnly)
		return false;

	if (!impl->imported_metadata.empty())
	{
		LOGE_LEVEL("Cannot use imported metadata together with whitelists.\n");
		return false;
	}

	impl->whitelist.reset(create_stream_archive_database(path, DatabaseMode::ReadOnly));

	if (!impl->whitelist)
		return false;

	if (!impl->whitelist->prepare())
	{
		impl->whitelist.reset();
		return false;
	}

	return true;
}